

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

LogMessage * pfederc::logLexerError(LogMessage *__return_storage_ptr__,Lexer *lexer,LexerError *err)

{
  Position *pos;
  Level logLevel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *msg;
  initializer_list<pfederc::LogMessage> __l;
  initializer_list<pfederc::LogMessage> __l_00;
  initializer_list<pfederc::LogMessage> __l_01;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  string local_d0;
  string local_b0;
  LogMessage local_90;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_48;
  
  pos = &err->pos;
  logLevel = err->logLevel;
  switch(err->err) {
  case LEX_ERR_GENERAL_INVALID_CHARACTER:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Invalid character",(allocator<char> *)&local_d0);
    break;
  case LEX_ERR_ID_NO_DIGIT_AFTER_ANYS:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Leading _ must not be followed by digit",
               (allocator<char> *)&local_d0);
    break;
  case LEX_ERR_ID_NOT_JUST_ANYS:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Identifier must not consist of just _",
               (allocator<char> *)&local_d0);
    break;
  case LEX_ERR_STR_INVALID_ESCAPE_CODE:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Invalid escape sequence",(allocator<char> *)&local_d0);
    break;
  case LEX_ERR_CHAR_INVALID_END:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Expected \'",&local_119)
    ;
    logCreateErrorMessage(&local_d0,lexer,pos,&local_b0);
    Lexer::getLineFromIndex_abi_cxx11_(&local_f8,lexer,(err->pos).startIndex);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::insert
                       ((ulong)&local_f8,
                        (char *)((err->pos).startIndex -
                                (lexer->lineIndices).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[(err->pos).line]));
    std::operator+(&local_118,"Fix: Insert \'\n",pbVar1);
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogMessage::LogMessage(&local_90,LVL_NOTE,&local_118,&local_48);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_48);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    __l._M_len = 1;
    __l._M_array = &local_90;
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118,__l,
               (allocator_type *)&local_f8);
    goto LAB_00107cfe;
  case LEX_ERR_STR_INVALID_END:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Expected \"",&local_119)
    ;
    logCreateErrorMessage(&local_d0,lexer,pos,&local_b0);
    Lexer::getLineFromIndex_abi_cxx11_(&local_f8,lexer,(err->pos).startIndex);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::insert
                       ((ulong)&local_f8,
                        (char *)((err->pos).startIndex -
                                (lexer->lineIndices).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[(err->pos).line]));
    std::operator+(&local_118,"Fix: Insert \"\n",pbVar1);
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogMessage::LogMessage(&local_90,LVL_NOTE,&local_118,&local_48);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_48);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    __l_01._M_len = 1;
    __l_01._M_array = &local_90;
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118,
               __l_01,(allocator_type *)&local_f8);
    goto LAB_00107cfe;
  case LEX_ERR_STR_HEXADECIMAL_CHAR:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Expected hexadecimal character",(allocator<char> *)&local_d0);
    break;
  case LEX_ERR_NUM_LEADING_ZERO:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Zero must not be the first character of decimal number",
               &local_119);
    logCreateErrorMessage(&local_d0,lexer,pos,&local_b0);
    Lexer::getLineFromIndex_abi_cxx11_(&local_f8,lexer,(err->pos).startIndex);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::erase
                       ((ulong)&local_f8,
                        (err->pos).startIndex -
                        (lexer->lineIndices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[(err->pos).line]);
    std::operator+(&local_118,"Fix: Remove zero\n",pbVar1);
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogMessage::LogMessage(&local_90,LVL_NOTE,&local_118,&local_48);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_48);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    __l_00._M_len = 1;
    __l_00._M_array = &local_90;
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118,
               __l_00,(allocator_type *)&local_f8);
LAB_00107cfe:
    LogMessage::LogMessage
              (__return_storage_ptr__,logLevel,&local_d0,
               (vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118);
    LogMessage::~LogMessage(&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    msg = &local_b0;
    goto LAB_00107df1;
  case LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Unexpected digit",(allocator<char> *)&local_d0);
    break;
  case LEX_ERR_NUM_UNEXPECTED_CHAR:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Unexpected character",(allocator<char> *)&local_d0);
    break;
  case LEX_ERR_REGION_COMMENT_END:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Expected \'*/\'",(allocator<char> *)&local_d0);
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Unknown error",(allocator<char> *)&local_d0);
  }
  msg = &local_118;
  logCreateErrorMessage((string *)&local_90,lexer,pos,msg);
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  LogMessage::LogMessage
            (__return_storage_ptr__,logLevel,(string *)&local_90,
             (vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_f8);
  std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector
            ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_f8);
  std::__cxx11::string::~string((string *)&local_90);
LAB_00107df1:
  std::__cxx11::string::~string((string *)msg);
  return __return_storage_ptr__;
}

Assistant:

LogMessage pfederc::logLexerError(const Lexer &lexer, const LexerError &err) noexcept {
  const Position &pos = err.getPosition();
  switch (err.getErrorCode()) {
  case LexerErrorCode::LEX_ERR_GENERAL_INVALID_CHARACTER:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Invalid character"));  
  case LexerErrorCode::LEX_ERR_ID_NO_DIGIT_AFTER_ANYS:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Leading _ must not be followed by digit"));  
  case LexerErrorCode::LEX_ERR_ID_NOT_JUST_ANYS:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Identifier must not consist of just _"));  
  case LexerErrorCode::LEX_ERR_STR_INVALID_ESCAPE_CODE:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Invalid escape sequence"));  
  case LexerErrorCode::LEX_ERR_CHAR_INVALID_END:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Expected '"),
      { _logLexerErrorCharInvalidEnd(lexer, err) });  
  case LexerErrorCode::LEX_ERR_STR_INVALID_END:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Expected \""),
      { _logLexerErrorStrInvalidEnd(lexer, err) });  
  case LexerErrorCode::LEX_ERR_STR_HEXADECIMAL_CHAR:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Expected hexadecimal character"));
  case LexerErrorCode::LEX_ERR_NUM_LEADING_ZERO:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Zero must not be the first character of decimal number"),
      { _logLexerErrorLeadingZero(lexer, err) });  
  case LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Unexpected digit"));  
  case LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR:
    return LogMessage(err.getLogLevel(), logCreateErrorMessage(lexer, pos, "Unexpected character"));  
  case LexerErrorCode::LEX_ERR_REGION_COMMENT_END:
    return LogMessage(err.getLogLevel(), logCreateErrorMessage(lexer, pos, "Expected '*/'"));
  default:
    return LogMessage(err.getLogLevel(), logCreateErrorMessage(lexer, pos, "Unknown error"));
  }
}